

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

monst * shkcatch(obj *obj,xchar x,xchar y)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  monst *mtmp;
  char *pcVar5;
  char *pcVar6;
  obj *poVar7;
  byte rmno;
  uint uVar8;
  undefined7 in_register_00000011;
  int iVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  
  iVar4 = (int)CONCAT71(in_register_00000011,y);
  iVar9 = (int)CONCAT71(in_register_00000031,x);
  uVar1 = *(uint *)&level->locations[iVar9][iVar4].field_0x6;
  uVar8 = uVar1 >> 0x10 & 0x3f;
  rmno = 0;
  if ((uVar1 >> 0x16 & 1) == 0 && 2 < uVar8) {
    rmno = 0;
    if ('\x11' < level->rooms[uVar8 - 3].rtype) {
      rmno = (byte)(uVar1 >> 0x10) & 0x3f;
    }
  }
  mtmp = shop_keeper(level,rmno);
  if (((mtmp == (monst *)0x0) || (iVar3 = inhishop(mtmp), iVar3 == 0)) ||
     ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000)) {
    return (monst *)0x0;
  }
  if (u.ushops[0] == (char)mtmp[0x1b].meating) {
    uVar1 = *(uint *)&level->locations[u.ux][u.uy].field_0x6;
    uVar8 = uVar1 >> 0x10 & 0x3f;
    if ((((uVar1 >> 0x16 & 1) == 0 && 2 < uVar8) && ((uVar1 & 0x3f0000) != 0)) &&
       ('\x11' < level->rooms[uVar8 - 3].rtype)) {
      return (monst *)0x0;
    }
  }
  iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)x,(int)y);
  if (2 < iVar3) {
    return (monst *)0x0;
  }
  if ((mtmp->mx == x) && (mtmp->my == y)) {
    return (monst *)0x0;
  }
  bVar2 = mnearto(mtmp,x,y,'\x01');
  if (bVar2 != '\0') {
    verbalize("Out of my way, scum!");
  }
  if ((viz_array[iVar4][iVar9] & 2U) == 0) goto LAB_00240b57;
  pcVar5 = Monnam(mtmp);
  if (mtmp->mx == x) {
    pcVar10 = " reaches over and";
    if (mtmp->my == y) {
      pcVar10 = "";
    }
  }
  else {
    pcVar10 = " reaches over and";
  }
  pcVar6 = xname(obj);
  pcVar6 = the(pcVar6);
  pline("%s nimbly%s catches %s.",pcVar5,pcVar10,pcVar6);
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002409a8;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0024094b;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00240942;
    }
    else {
LAB_00240942:
      if (ublindf == (obj *)0x0) goto LAB_002409f7;
LAB_0024094b:
      if (ublindf->oartifact != '\x1d') goto LAB_002409f7;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_002409a8;
LAB_002409f7:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar7 = which_armor(mtmp,4), poVar7 == (obj *)0x0 ||
        (poVar7 = which_armor(mtmp,4), poVar7->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00240a56;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00240a51;
      }
      else {
LAB_00240a51:
        if (ublindf != (obj *)0x0) {
LAB_00240a56:
          if (ublindf->oartifact == '\x1d') goto LAB_00240ae9;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00240b4d;
      }
LAB_00240ae9:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41))))
      goto LAB_00240b4d;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
      map_invisible(x,y);
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_002409f7;
LAB_002409a8:
    uVar1 = *(uint *)&mtmp->field_0x60;
    if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_002409e9;
      goto LAB_002409f7;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_002409f7;
LAB_002409e9:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_002409f7;
  }
LAB_00240b4d:
  (*windowprocs.win_delay)();
LAB_00240b57:
  subfrombill(obj,mtmp);
  mpickobj(mtmp,obj);
  return mtmp;
}

Assistant:

struct monst *shkcatch(struct obj *obj, xchar x, xchar y)
{
	struct monst *shkp;

	if (!(shkp = shop_keeper(level, inside_shop(level, x, y))) ||
	    !inhishop(shkp)) return 0;

	if (shkp->mcanmove && !shkp->msleeping &&
	    (*u.ushops != ESHK(shkp)->shoproom || !inside_shop(level, u.ux, u.uy)) &&
	    dist2(shkp->mx, shkp->my, x, y) < 3 &&
	    /* if it is the shk's pos, you hit and anger him */
	    (shkp->mx != x || shkp->my != y)) {
		if (mnearto(shkp, x, y, TRUE))
		    verbalize("Out of my way, scum!");
		if (cansee(x, y)) {
		    pline("%s nimbly%s catches %s.",
			  Monnam(shkp),
			  (x == shkp->mx && y == shkp->my) ? "" : " reaches over and",
			  the(xname(obj)));
		    if (!canspotmon(level, shkp))
			map_invisible(x, y);
		    win_delay_output();
		}
		subfrombill(obj, shkp);
		mpickobj(shkp, obj);
		return shkp;
	}
	return NULL;
}